

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O1

Import * __thiscall
jsonnet::internal::Allocator::clone<jsonnet::internal::Import>(Allocator *this,Import *ast)

{
  size_t *psVar1;
  pointer pcVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  Import *pIVar6;
  _List_node_base *p_Var7;
  
  pIVar6 = (Import *)operator_new(0x88);
  (pIVar6->super_AST)._vptr_AST = (_func_int **)&PTR__AST_00298b00;
  (pIVar6->super_AST).location.file._M_dataplus._M_p =
       (pointer)&(pIVar6->super_AST).location.file.field_2;
  pcVar2 = (ast->super_AST).location.file._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(pIVar6->super_AST).location,pcVar2,
             pcVar2 + (ast->super_AST).location.file._M_string_length);
  uVar3 = (ast->super_AST).location.begin.line;
  uVar4 = (ast->super_AST).location.begin.column;
  uVar5 = (ast->super_AST).location.end.column;
  (pIVar6->super_AST).location.end.line = (ast->super_AST).location.end.line;
  (pIVar6->super_AST).location.end.column = uVar5;
  (pIVar6->super_AST).location.begin.line = uVar3;
  (pIVar6->super_AST).location.begin.column = uVar4;
  (pIVar6->super_AST).type = (ast->super_AST).type;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&(pIVar6->super_AST).openFodder,&(ast->super_AST).openFodder);
  std::
  vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::vector(&(pIVar6->super_AST).freeVariables,&(ast->super_AST).freeVariables);
  (pIVar6->super_AST)._vptr_AST = (_func_int **)&PTR__AST_00298bc8;
  pIVar6->file = ast->file;
  p_Var7 = (_List_node_base *)operator_new(0x18);
  p_Var7[1]._M_next = (_List_node_base *)pIVar6;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  psVar1 = &(this->allocated).
            super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return pIVar6;
}

Assistant:

T *clone(T *ast)
    {
        auto r = new T(*ast);
        allocated.push_back(r);
        return r;
    }